

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

int string2ll(char *s,size_t slen,longlong *value)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  if (slen == 0) {
    return -1;
  }
  if ((slen == 1) && (*s == '0')) {
    if (value == (longlong *)0x0) {
      return 0;
    }
  }
  else {
    cVar1 = *s;
    uVar6 = 1;
    if (cVar1 == '-') {
      if (slen == 1) {
        return -1;
      }
      s = s + 1;
      uVar6 = 2;
    }
    cVar2 = *s;
    if ((byte)(cVar2 - 0x31U) < 9) {
      uVar5 = (ulong)(byte)(cVar2 - 0x30);
      if (uVar6 < slen) {
        lVar7 = 0;
        do {
          if ((byte)(s[lVar7 + 1] - 0x3aU) < 0xf6) {
            return -1;
          }
          if (0x1999999999999999 < uVar5) {
            return -1;
          }
          uVar3 = uVar5 * 10;
          uVar4 = (ulong)(byte)(s[lVar7 + 1] - 0x30);
          uVar5 = uVar4 + uVar3;
          if (CARRY8(uVar4,uVar3)) {
            return -1;
          }
          lVar7 = lVar7 + 1;
        } while (slen - uVar6 != lVar7);
      }
      if (cVar1 == '-') {
        if (0x8000000000000000 < uVar5) {
          return -1;
        }
        if (value == (longlong *)0x0) {
          return 0;
        }
        uVar5 = -uVar5;
      }
      else {
        if ((long)uVar5 < 0) {
          return -1;
        }
        if (value == (longlong *)0x0) {
          return 0;
        }
      }
      goto LAB_0010865a;
    }
    if (slen != 1 || cVar2 != '0') {
      return -1;
    }
  }
  uVar5 = 0;
LAB_0010865a:
  *value = uVar5;
  return 0;
}

Assistant:

static int string2ll(const char *s, size_t slen, long long *value) {
    const char *p = s;
    size_t plen = 0;
    int negative = 0;
    unsigned long long v;

    if (plen == slen)
        return REDIS_ERR;

    /* Special case: first and only digit is 0. */
    if (slen == 1 && p[0] == '0') {
        if (value != NULL) *value = 0;
        return REDIS_OK;
    }

    if (p[0] == '-') {
        negative = 1;
        p++; plen++;

        /* Abort on only a negative sign. */
        if (plen == slen)
            return REDIS_ERR;
    }

    /* First digit should be 1-9, otherwise the string should just be 0. */
    if (p[0] >= '1' && p[0] <= '9') {
        v = p[0]-'0';
        p++; plen++;
    } else if (p[0] == '0' && slen == 1) {
        *value = 0;
        return REDIS_OK;
    } else {
        return REDIS_ERR;
    }

    while (plen < slen && p[0] >= '0' && p[0] <= '9') {
        if (v > (ULLONG_MAX / 10)) /* Overflow. */
            return REDIS_ERR;
        v *= 10;

        if (v > (ULLONG_MAX - (p[0]-'0'))) /* Overflow. */
            return REDIS_ERR;
        v += p[0]-'0';

        p++; plen++;
    }

    /* Return if not all bytes were used. */
    if (plen < slen)
        return REDIS_ERR;

    if (negative) {
        if (v > ((unsigned long long)(-(LLONG_MIN+1))+1)) /* Overflow. */
            return REDIS_ERR;
        if (value != NULL) *value = -v;
    } else {
        if (v > LLONG_MAX) /* Overflow. */
            return REDIS_ERR;
        if (value != NULL) *value = v;
    }
    return REDIS_OK;
}